

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.cc
# Opt level: O0

StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> * __thiscall
draco::Decoder::DecodeMeshFromBuffer(Decoder *this,DecoderBuffer *in_buffer)

{
  bool bVar1;
  Mesh *in_RDI;
  Status _local_status;
  unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> mesh;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6f;
  undefined1 uVar2;
  StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *this_00;
  Mesh *this_01;
  Mesh *in_stack_ffffffffffffffa8;
  DecoderBuffer *in_stack_ffffffffffffffb0;
  Decoder *in_stack_ffffffffffffffb8;
  
  this_01 = in_RDI;
  operator_new(0xd8);
  Mesh::Mesh(this_01);
  this_00 = (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)
            &stack0xffffffffffffffe0;
  std::unique_ptr<draco::Mesh,std::default_delete<draco::Mesh>>::
  unique_ptr<std::default_delete<draco::Mesh>,void>
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_00,
             (pointer)CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68));
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::get
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_00);
  DecodeBufferToGeometry
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  bVar1 = Status::ok((Status *)&stack0xffffffffffffffa8);
  uVar2 = bVar1;
  if (!bVar1) {
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (this_00,(Status *)CONCAT17(bVar1,in_stack_ffffffffffffff68));
  }
  Status::~Status((Status *)0x14e01c);
  if (bVar1) {
    StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_>::StatusOr
              (this_00,(unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)
                       CONCAT17(uVar2,in_stack_ffffffffffffff68));
  }
  std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>::~unique_ptr
            ((unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_> *)this_00);
  return (StatusOr<std::unique_ptr<draco::Mesh,_std::default_delete<draco::Mesh>_>_> *)in_RDI;
}

Assistant:

StatusOr<std::unique_ptr<Mesh>> Decoder::DecodeMeshFromBuffer(
    DecoderBuffer *in_buffer) {
  std::unique_ptr<Mesh> mesh(new Mesh());
  DRACO_RETURN_IF_ERROR(DecodeBufferToGeometry(in_buffer, mesh.get()))
  return std::move(mesh);
}